

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O2

ion_err_t dictionary_open(ion_dictionary_handler_t *handler,ion_dictionary_t *dictionary,
                         ion_dictionary_config_info_t *config)

{
  int key_size;
  int value_size;
  ion_dictionary_id_t id;
  ion_key_type_t key_type;
  _func_ion_status_t_ion_dictionary_t_ptr_ion_key_t_ion_value_t *p_Var1;
  _func_ion_err_t_ion_dictionary_t_ptr *p_Var2;
  ion_dictionary_compare_t p_Var3;
  ion_dictionary_handler_t *piVar4;
  ion_key_t pvVar5;
  ion_err_t iVar6;
  char cVar7;
  uint uVar8;
  ion_key_t pvVar9;
  ion_status_t iVar10;
  code *pcVar11;
  ion_key_size_t extraout_EDX;
  ion_dictionary_handler_t **ppiVar12;
  undefined8 uStack_100;
  ulong auStack_f8 [2];
  undefined1 local_e8 [8];
  ion_dictionary_handler_t fallback_handler;
  undefined1 local_78 [8];
  ion_predicate_t predicate;
  ion_dictionary_t fallback_dict;
  ion_record_t record;
  ion_dict_cursor_t *cursor;
  
  uVar8 = config->type - key_type_numeric_unsigned;
  if (uVar8 < 3) {
    pcVar11 = (code *)(&PTR_dictionary_compare_unsigned_value_0010bda8)[uVar8];
  }
  else {
    pcVar11 = dictionary_compare_signed_value;
  }
  auStack_f8[1] = 0x105d00;
  iVar6 = (*handler->open_dictionary)(handler,dictionary,config,pcVar11);
  if (iVar6 == '\0') {
LAB_00105e6f:
    dictionary->status = '\0';
    dictionary->instance->id = config->id;
    iVar6 = '\0';
  }
  else if (iVar6 == '\x0f') {
    record.value = (ion_value_t)0x0;
    auStack_f8[1] = 0x105d2b;
    ffdict_init((ion_dictionary_handler_t *)local_e8);
    fallback_handler.close_dictionary._0_4_ = config->id;
    fallback_handler.close_dictionary._4_1_ = 0;
    auStack_f8[1] = 0x105d62;
    iVar6 = dictionary_open((ion_dictionary_handler_t *)local_e8,
                            (ion_dictionary_t *)&predicate.destroy,
                            (ion_dictionary_config_info_t *)&fallback_handler.close_dictionary);
    if (iVar6 == '\0') {
      auStack_f8[1] = 0x105d7b;
      dictionary_build_predicate((ion_predicate_t *)local_78,'\x02');
      auStack_f8[1] = 0x105d8d;
      iVar6 = (**(code **)(fallback_dict.instance + 1))
                        (&predicate.destroy,(ion_predicate_t *)local_78,&record.value);
      if (iVar6 == '\0') {
        key_size = config->key_size;
        fallback_dict.handler =
             (ion_dictionary_handler_t *)(local_e8 + -((long)key_size + 0xfU & 0xfffffffffffffff0));
        value_size = config->value_size;
        pvVar9 = (ion_key_t)
                 ((long)(local_e8 + -((long)key_size + 0xfU & 0xfffffffffffffff0)) -
                 ((long)value_size + 0xfU & 0xfffffffffffffff0));
        record.key = pvVar9;
        id = config->id;
        key_type = config->type;
        *(ulong *)((long)pvVar9 + -0x10) = (ulong)config->dictionary_size;
        *(undefined8 *)((long)pvVar9 + -0x18) = 0x105de4;
        iVar6 = dictionary_create(handler,dictionary,id,key_type,key_size,value_size,
                                  *(ion_dictionary_size_t *)((long)pvVar9 + -0x10));
        if (iVar6 == '\0') {
          do {
            pcVar11 = *(code **)((long)record.value + 0x18);
            *(undefined8 *)((long)pvVar9 + -8) = 0x105e0a;
            ppiVar12 = &fallback_dict.handler;
            cVar7 = (*pcVar11)();
            pvVar5 = record.key;
            piVar4 = fallback_dict.handler;
            if ((cVar7 != '\x02') && (cVar7 != '\x04')) {
              if (cVar7 != '\x01') {
                return '\x12';
              }
              pcVar11 = *(code **)((long)record.value + 0x20);
              *(undefined8 *)((long)pvVar9 + -8) = 0x105e5d;
              (*pcVar11)();
              p_Var3 = fallback_dict.instance[1].compare;
              *(undefined8 *)((long)pvVar9 + -8) = 0x105e68;
              cVar7 = (*p_Var3)(&predicate.destroy,ppiVar12,extraout_EDX);
              if (cVar7 != '\0') {
                return cVar7;
              }
              goto LAB_00105e6f;
            }
            p_Var1 = dictionary->handler->insert;
            *(undefined8 *)((long)pvVar9 + -8) = 0x105e27;
            iVar10 = (*p_Var1)(dictionary,piVar4,pvVar5);
            iVar6 = iVar10.error;
          } while (iVar6 == '\0');
          pcVar11 = *(code **)((long)record.value + 0x20);
          *(undefined8 *)((long)pvVar9 + -8) = 0x105e39;
          (*pcVar11)();
          *(undefined8 *)((long)pvVar9 + -8) = 0x105e42;
          dictionary_close((ion_dictionary_t *)&predicate.destroy);
          p_Var2 = dictionary->handler->delete_dictionary;
          *(undefined8 *)((long)pvVar9 + -8) = 0x105e4c;
          (*p_Var2)(dictionary);
        }
      }
    }
  }
  else {
    dictionary->status = '\x02';
  }
  return iVar6;
}

Assistant:

ion_err_t
dictionary_open(
	ion_dictionary_handler_t		*handler,
	ion_dictionary_t				*dictionary,
	ion_dictionary_config_info_t	*config
) {
	ion_dictionary_compare_t compare	= dictionary_switch_compare(config->type);

	ion_err_t error						= handler->open_dictionary(handler, dictionary, config, compare);

	if (err_not_implemented == error) {
		ion_predicate_t				predicate;
		ion_dict_cursor_t			*cursor = NULL;
		ion_record_t				record;
		ion_dictionary_handler_t	fallback_handler;
		ion_dictionary_t			fallback_dict;
		ion_err_t					err;

		ffdict_init(&fallback_handler);

		ion_dictionary_config_info_t fallback_config = {
			config->id, 0, config->type, config->key_size, config->value_size, 1
		};

		err = dictionary_open(&fallback_handler, &fallback_dict, &fallback_config);

		if (err_ok != err) {
			return err;
		}

		dictionary_build_predicate(&predicate, predicate_all_records);
		err = dictionary_find(&fallback_dict, &predicate, &cursor);

		if (err_ok != err) {
			return err;
		}

		record.key		= alloca(config->key_size);
		record.value	= alloca(config->value_size);

		err				= dictionary_create(handler, dictionary, config->id, config->type, config->key_size, config->value_size, config->dictionary_size);

		if (err_ok != err) {
			return err;
		}

		ion_cursor_status_t cursor_status;

		while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record)) || cs_cursor_initialized == cursor_status) {
			ion_status_t status = dictionary_insert(dictionary, record.key, record.value);

			if (err_ok != status.error) {
				cursor->destroy(&cursor);
				dictionary_close(&fallback_dict);
				dictionary_delete_dictionary(dictionary);
				return status.error;
			}
		}

		if (cursor_status != cs_end_of_results) {
			return err_uninitialized;
		}

		cursor->destroy(&cursor);

		err = dictionary_delete_dictionary(&fallback_dict);

		if (err_ok != err) {
			return err;
		}

		error = err_ok;
	}

	if (err_ok == error) {
		dictionary->status			= ion_dictionary_status_ok;
		dictionary->instance->id	= config->id;
	}
	else {
		dictionary->status = ion_dictionary_status_error;
	}

	return error;
}